

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

bool __thiscall CInput::CJoystick::Relative(CJoystick *this,float *pX,float *pY)

{
  CInput *pCVar1;
  CConfig *pCVar2;
  float *in_RDX;
  float *in_RSI;
  CJoystick *in_RDI;
  long in_FS_OFFSET;
  float nx;
  float ny;
  float fVar3;
  float fVar4;
  float Factor;
  float DeadZone;
  float Len;
  vec2 RawJoystickPos;
  bool local_11;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = Input(in_RDI);
  pCVar2 = Config(pCVar1);
  if (pCVar2->m_JoystickEnable == 0) {
    local_11 = false;
  }
  else {
    pCVar1 = Input(in_RDI);
    pCVar2 = Config(pCVar1);
    (*(in_RDI->super_IJoystick)._vptr_IJoystick[6])(in_RDI,(ulong)(uint)pCVar2->m_JoystickX);
    pCVar1 = Input(in_RDI);
    pCVar2 = Config(pCVar1);
    (*(in_RDI->super_IJoystick)._vptr_IJoystick[6])(in_RDI,(ulong)(uint)pCVar2->m_JoystickY);
    vector2_base<float>::vector2_base((vector2_base<float> *)&local_10,nx,ny);
    fVar3 = length((vector2_base<float> *)0x133178);
    Input(in_RDI);
    fVar4 = GetJoystickDeadzone((CInput *)0x133190);
    if (fVar3 <= fVar4) {
      local_11 = false;
    }
    else {
      fVar4 = maximum<float>((fVar3 - fVar4) / (1.0 - fVar4),0.001);
      fVar3 = (fVar4 * 0.1) / fVar3;
      *in_RSI = local_10.x * fVar3;
      *in_RDX = local_c * fVar3;
      local_11 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11;
  }
  __stack_chk_fail();
}

Assistant:

bool CInput::CJoystick::Relative(float *pX, float *pY)
{
	if(!Input()->Config()->m_JoystickEnable)
		return false;

	const vec2 RawJoystickPos = vec2(GetAxisValue(Input()->Config()->m_JoystickX), GetAxisValue(Input()->Config()->m_JoystickY));
	const float Len = length(RawJoystickPos);
	const float DeadZone = Input()->GetJoystickDeadzone();
	if(Len > DeadZone)
	{
		const float Factor = 0.1f * maximum((Len - DeadZone) / (1 - DeadZone), 0.001f) / Len;
		*pX = RawJoystickPos.x * Factor;
		*pY = RawJoystickPos.y * Factor;
		return true;
	}
	return false;
}